

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_status_enum.c
# Opt level: O0

void check_errorstrings(amqp_status_enum start,amqp_status_enum end)

{
  int iVar1;
  char *pcVar2;
  int in_ESI;
  uint in_EDI;
  char *err;
  int i;
  uint local_c;
  
  local_c = in_EDI;
  while( true ) {
    if ((int)local_c <= in_ESI) {
      return;
    }
    pcVar2 = amqp_error_string2(local_c);
    iVar1 = strcmp(pcVar2,"(unknown error)");
    if (iVar1 == 0) break;
    local_c = local_c - 1;
  }
  pcVar2 = "";
  if ((int)local_c < 0) {
    pcVar2 = "-";
  }
  printf("amqp_status_enum value %s%X",pcVar2,(ulong)local_c);
  abort();
}

Assistant:

static void check_errorstrings(amqp_status_enum start, amqp_status_enum end) {
  int i;
  for (i = start; i > end; --i) {
    const char* err = amqp_error_string2(i);
    if (0 == strcmp(err, "(unknown error)")) {
      printf("amqp_status_enum value %s%X", i < 0 ? "-" : "", (unsigned)i);
      abort();
    }
  }
}